

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O0

REF_STATUS
ref_gather_bin_ugrid(REF_GRID ref_grid,char *filename,REF_BOOL swap_endian,REF_BOOL sixty_four_bit)

{
  undefined1 uVar1;
  char *pcVar2;
  undefined4 uVar3;
  uint uVar4;
  size_t sVar5;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_LONG ref_private_status_reis_bi_13;
  REF_LONG ref_private_status_reis_ai_13;
  char *yp_13;
  char *xp_13;
  int y_13;
  REF_LONG ref_private_status_reis_bi_12;
  REF_LONG ref_private_status_reis_ai_12;
  char *yp_12;
  char *xp_12;
  int y_12;
  REF_LONG ref_private_status_reis_bi_11;
  REF_LONG ref_private_status_reis_ai_11;
  char *yp_11;
  char *xp_11;
  int y_11;
  REF_LONG ref_private_status_reis_bi_10;
  REF_LONG ref_private_status_reis_ai_10;
  char *yp_10;
  char *xp_10;
  int y_10;
  REF_LONG ref_private_status_reis_bi_9;
  REF_LONG ref_private_status_reis_ai_9;
  char *yp_9;
  char *xp_9;
  int y_9;
  REF_LONG ref_private_status_reis_bi_8;
  REF_LONG ref_private_status_reis_ai_8;
  char *yp_8;
  char *xp_8;
  int y_8;
  REF_LONG ref_private_status_reis_bi_7;
  REF_LONG ref_private_status_reis_ai_7;
  char *yp_7;
  char *xp_7;
  int y_7;
  REF_LONG ref_private_status_reis_bi_6;
  REF_LONG ref_private_status_reis_ai_6;
  char *yp_6;
  char *xp_6;
  long y_6;
  REF_LONG ref_private_status_reis_bi_5;
  REF_LONG ref_private_status_reis_ai_5;
  char *yp_5;
  char *xp_5;
  long y_5;
  REF_LONG ref_private_status_reis_bi_4;
  REF_LONG ref_private_status_reis_ai_4;
  char *yp_4;
  char *xp_4;
  long y_4;
  REF_LONG ref_private_status_reis_bi_3;
  REF_LONG ref_private_status_reis_ai_3;
  char *yp_3;
  char *xp_3;
  long y_3;
  REF_LONG ref_private_status_reis_bi_2;
  REF_LONG ref_private_status_reis_ai_2;
  char *yp_2;
  char *xp_2;
  long y_2;
  REF_LONG ref_private_status_reis_bi_1;
  REF_LONG ref_private_status_reis_ai_1;
  char *yp_1;
  char *xp_1;
  long y_1;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  char *yp;
  char *xp;
  long y;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL pad;
  REF_BOOL select_faceid;
  REF_BOOL faceid_insted_of_c2n;
  REF_BOOL version;
  REF_INT faceid;
  REF_INT group;
  REF_CELL ref_cell;
  undefined1 uStack_88;
  undefined1 uStack_87;
  undefined1 uStack_86;
  undefined1 uStack_85;
  REF_INT size_int;
  REF_LONG size_long;
  REF_LONG nhex;
  REF_LONG npri;
  REF_LONG npyr;
  REF_LONG ntet;
  REF_LONG nqua;
  REF_LONG ntri;
  REF_GLOB nnode;
  REF_NODE ref_node;
  REF_MPI ref_mpi;
  FILE *file;
  REF_BOOL sixty_four_bit_local;
  REF_BOOL swap_endian_local;
  char *filename_local;
  REF_GRID ref_grid_local;
  
  ref_node = (REF_NODE)ref_grid->mpi;
  nnode = (REF_GLOB)ref_grid->node;
  file._0_4_ = sixty_four_bit;
  file._4_4_ = swap_endian;
  _sixty_four_bit_local = filename;
  filename_local = (char *)ref_grid;
  uVar4 = ref_node_synchronize_globals((REF_NODE)nnode);
  if (uVar4 == 0) {
    ntri = *(REF_LONG *)(nnode + 0x68);
    uVar4 = ref_cell_ncell(*(REF_CELL *)(filename_local + 0x28),(REF_NODE)nnode,&nqua);
    if (uVar4 == 0) {
      uVar4 = ref_cell_ncell(*(REF_CELL *)(filename_local + 0x40),(REF_NODE)nnode,&ntet);
      if (uVar4 == 0) {
        uVar4 = ref_cell_ncell(*(REF_CELL *)(filename_local + 0x50),(REF_NODE)nnode,&npyr);
        if (uVar4 == 0) {
          uVar4 = ref_cell_ncell(*(REF_CELL *)(filename_local + 0x58),(REF_NODE)nnode,&npri);
          if (uVar4 == 0) {
            uVar4 = ref_cell_ncell(*(REF_CELL *)(filename_local + 0x60),(REF_NODE)nnode,&nhex);
            if (uVar4 == 0) {
              uVar4 = ref_cell_ncell(*(REF_CELL *)(filename_local + 0x68),(REF_NODE)nnode,&size_long
                                    );
              if (uVar4 == 0) {
                ref_mpi = (REF_MPI)0x0;
                if (*(int *)(*(long *)filename_local + 4) == 0) {
                  ref_mpi = (REF_MPI)fopen(_sixty_four_bit_local,"w");
                  if ((FILE *)ref_mpi == (FILE *)0x0) {
                    printf("unable to open %s\n",_sixty_four_bit_local);
                  }
                  pcVar2 = _uStack_88;
                  if (ref_mpi == (REF_MPI)0x0) {
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                           ,0xaf5,"ref_gather_bin_ugrid","unable to open file");
                    return 2;
                  }
                  uStack_88 = (undefined1)ntri;
                  uVar1 = uStack_88;
                  if ((REF_BOOL)file == 0) {
                    uVar3 = (int)ntri;
                    if (file._4_4_ != 0) {
                      xp_7._7_1_ = uStack_88;
                      xp_7._6_1_ = ref_cell._5_1_;
                      xp_7._5_1_ = ref_cell._6_1_;
                      xp_7._4_1_ = ref_cell._7_1_;
                      ref_cell._4_4_ = xp_7._4_4_;
                      uVar3 = ref_cell._4_4_;
                    }
                    ref_cell._4_4_ = uVar3;
                    _uStack_88 = pcVar2;
                    sVar5 = fwrite((void *)((long)&ref_cell + 4),4,1,(FILE *)ref_mpi);
                    uVar3 = ref_cell._4_4_;
                    if (sVar5 != 1) {
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                             ,0xb12,"ref_gather_bin_ugrid","nnode",1,sVar5);
                      return 1;
                    }
                    ref_cell._4_4_ = (undefined4)nqua;
                    if (file._4_4_ != 0) {
                      ref_cell._4_1_ = (undefined1)(undefined4)nqua;
                      xp_8._7_1_ = ref_cell._4_1_;
                      ref_cell._5_1_ = SUB41(uVar3,1);
                      xp_8._6_1_ = ref_cell._5_1_;
                      ref_cell._6_1_ = SUB41(uVar3,2);
                      xp_8._5_1_ = ref_cell._6_1_;
                      ref_cell._7_1_ = SUB41(uVar3,3);
                      xp_8._4_1_ = ref_cell._7_1_;
                      ref_cell._4_4_ = xp_8._4_4_;
                    }
                    sVar5 = fwrite((void *)((long)&ref_cell + 4),4,1,(FILE *)ref_mpi);
                    uVar3 = ref_cell._4_4_;
                    if (sVar5 != 1) {
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                             ,0xb16,"ref_gather_bin_ugrid","ntri",1,sVar5);
                      return 1;
                    }
                    ref_cell._4_4_ = (undefined4)ntet;
                    if (file._4_4_ != 0) {
                      ref_cell._4_1_ = (undefined1)(undefined4)ntet;
                      xp_9._7_1_ = ref_cell._4_1_;
                      ref_cell._5_1_ = SUB41(uVar3,1);
                      xp_9._6_1_ = ref_cell._5_1_;
                      ref_cell._6_1_ = SUB41(uVar3,2);
                      xp_9._5_1_ = ref_cell._6_1_;
                      ref_cell._7_1_ = SUB41(uVar3,3);
                      xp_9._4_1_ = ref_cell._7_1_;
                      ref_cell._4_4_ = xp_9._4_4_;
                    }
                    sVar5 = fwrite((void *)((long)&ref_cell + 4),4,1,(FILE *)ref_mpi);
                    uVar3 = ref_cell._4_4_;
                    if (sVar5 != 1) {
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                             ,0xb19,"ref_gather_bin_ugrid","nqua",1,sVar5);
                      return 1;
                    }
                    ref_cell._4_4_ = (undefined4)npyr;
                    if (file._4_4_ != 0) {
                      ref_cell._4_1_ = (undefined1)(undefined4)npyr;
                      xp_10._7_1_ = ref_cell._4_1_;
                      ref_cell._5_1_ = SUB41(uVar3,1);
                      xp_10._6_1_ = ref_cell._5_1_;
                      ref_cell._6_1_ = SUB41(uVar3,2);
                      xp_10._5_1_ = ref_cell._6_1_;
                      ref_cell._7_1_ = SUB41(uVar3,3);
                      xp_10._4_1_ = ref_cell._7_1_;
                      ref_cell._4_4_ = xp_10._4_4_;
                    }
                    sVar5 = fwrite((void *)((long)&ref_cell + 4),4,1,(FILE *)ref_mpi);
                    uVar3 = ref_cell._4_4_;
                    if (sVar5 != 1) {
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                             ,0xb1d,"ref_gather_bin_ugrid","ntet",1,sVar5);
                      return 1;
                    }
                    ref_cell._4_4_ = (undefined4)npri;
                    if (file._4_4_ != 0) {
                      ref_cell._4_1_ = (undefined1)(undefined4)npri;
                      xp_11._7_1_ = ref_cell._4_1_;
                      ref_cell._5_1_ = SUB41(uVar3,1);
                      xp_11._6_1_ = ref_cell._5_1_;
                      ref_cell._6_1_ = SUB41(uVar3,2);
                      xp_11._5_1_ = ref_cell._6_1_;
                      ref_cell._7_1_ = SUB41(uVar3,3);
                      xp_11._4_1_ = ref_cell._7_1_;
                      ref_cell._4_4_ = xp_11._4_4_;
                    }
                    sVar5 = fwrite((void *)((long)&ref_cell + 4),4,1,(FILE *)ref_mpi);
                    uVar3 = ref_cell._4_4_;
                    if (sVar5 != 1) {
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                             ,0xb20,"ref_gather_bin_ugrid","npyr",1,sVar5);
                      return 1;
                    }
                    ref_cell._4_4_ = (undefined4)nhex;
                    if (file._4_4_ != 0) {
                      ref_cell._4_1_ = (undefined1)(undefined4)nhex;
                      xp_12._7_1_ = ref_cell._4_1_;
                      ref_cell._5_1_ = SUB41(uVar3,1);
                      xp_12._6_1_ = ref_cell._5_1_;
                      ref_cell._6_1_ = SUB41(uVar3,2);
                      xp_12._5_1_ = ref_cell._6_1_;
                      ref_cell._7_1_ = SUB41(uVar3,3);
                      xp_12._4_1_ = ref_cell._7_1_;
                      ref_cell._4_4_ = xp_12._4_4_;
                    }
                    sVar5 = fwrite((void *)((long)&ref_cell + 4),4,1,(FILE *)ref_mpi);
                    if (sVar5 != 1) {
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                             ,0xb23,"ref_gather_bin_ugrid","npri",1,sVar5);
                      return 1;
                    }
                    ref_cell._4_4_ = (undefined4)size_long;
                    if (file._4_4_ != 0) {
                      ref_cell._4_1_ = (undefined1)(undefined4)size_long;
                      xp_13._7_1_ = ref_cell._4_1_;
                      ref_cell._5_1_ = (undefined1)((uint)(undefined4)size_long >> 8);
                      xp_13._6_1_ = ref_cell._5_1_;
                      ref_cell._6_1_ = (undefined1)((uint)(undefined4)size_long >> 0x10);
                      xp_13._5_1_ = ref_cell._6_1_;
                      ref_cell._7_1_ = (undefined1)((uint)(undefined4)size_long >> 0x18);
                      xp_13._4_1_ = ref_cell._7_1_;
                      ref_cell._4_4_ = xp_13._4_4_;
                    }
                    sVar5 = fwrite((void *)((long)&ref_cell + 4),4,1,(FILE *)ref_mpi);
                    if (sVar5 != 1) {
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                             ,0xb26,"ref_gather_bin_ugrid","nhex",1,sVar5);
                      return 1;
                    }
                  }
                  else {
                    _uStack_88 = (char *)ntri;
                    if (file._4_4_ != 0) {
                      xp._7_1_ = uVar1;
                      uStack_87 = (undefined1)((ulong)ntri >> 8);
                      xp._6_1_ = uStack_87;
                      uStack_86 = (undefined1)((ulong)ntri >> 0x10);
                      xp._5_1_ = uStack_86;
                      uStack_85 = (undefined1)((ulong)ntri >> 0x18);
                      xp._4_1_ = uStack_85;
                      size_int._0_1_ = (undefined1)((ulong)ntri >> 0x20);
                      xp._3_1_ = (undefined1)size_int;
                      size_int._1_1_ = (undefined1)((ulong)ntri >> 0x28);
                      xp._2_1_ = size_int._1_1_;
                      size_int._2_1_ = (undefined1)((ulong)ntri >> 0x30);
                      xp._1_1_ = size_int._2_1_;
                      size_int._3_1_ = (undefined1)((ulong)ntri >> 0x38);
                      xp._0_1_ = size_int._3_1_;
                      _uStack_88 = xp;
                    }
                    sVar5 = fwrite(&stack0xffffffffffffff78,8,1,(FILE *)ref_mpi);
                    if (sVar5 != 1) {
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                             ,0xafa,"ref_gather_bin_ugrid","nnode",1,sVar5);
                      return 1;
                    }
                    _uStack_88 = (char *)nqua;
                    if (file._4_4_ != 0) {
                      uStack_88 = (undefined1)nqua;
                      xp_1._7_1_ = uStack_88;
                      uStack_87 = (undefined1)((ulong)nqua >> 8);
                      xp_1._6_1_ = uStack_87;
                      uStack_86 = (undefined1)((ulong)nqua >> 0x10);
                      xp_1._5_1_ = uStack_86;
                      uStack_85 = (undefined1)((ulong)nqua >> 0x18);
                      xp_1._4_1_ = uStack_85;
                      size_int._0_1_ = (undefined1)((ulong)nqua >> 0x20);
                      xp_1._3_1_ = (undefined1)size_int;
                      size_int._1_1_ = (undefined1)((ulong)nqua >> 0x28);
                      xp_1._2_1_ = size_int._1_1_;
                      size_int._2_1_ = (undefined1)((ulong)nqua >> 0x30);
                      xp_1._1_1_ = size_int._2_1_;
                      size_int._3_1_ = (undefined1)((ulong)nqua >> 0x38);
                      xp_1._0_1_ = size_int._3_1_;
                      _uStack_88 = xp_1;
                    }
                    sVar5 = fwrite(&stack0xffffffffffffff78,8,1,(FILE *)ref_mpi);
                    if (sVar5 != 1) {
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                             ,0xafe,"ref_gather_bin_ugrid","ntri",1,sVar5);
                      return 1;
                    }
                    _uStack_88 = (char *)ntet;
                    if (file._4_4_ != 0) {
                      uStack_88 = (undefined1)ntet;
                      xp_2._7_1_ = uStack_88;
                      uStack_87 = (undefined1)((ulong)ntet >> 8);
                      xp_2._6_1_ = uStack_87;
                      uStack_86 = (undefined1)((ulong)ntet >> 0x10);
                      xp_2._5_1_ = uStack_86;
                      uStack_85 = (undefined1)((ulong)ntet >> 0x18);
                      xp_2._4_1_ = uStack_85;
                      size_int._0_1_ = (undefined1)((ulong)ntet >> 0x20);
                      xp_2._3_1_ = (undefined1)size_int;
                      size_int._1_1_ = (undefined1)((ulong)ntet >> 0x28);
                      xp_2._2_1_ = size_int._1_1_;
                      size_int._2_1_ = (undefined1)((ulong)ntet >> 0x30);
                      xp_2._1_1_ = size_int._2_1_;
                      size_int._3_1_ = (undefined1)((ulong)ntet >> 0x38);
                      xp_2._0_1_ = size_int._3_1_;
                      _uStack_88 = xp_2;
                    }
                    sVar5 = fwrite(&stack0xffffffffffffff78,8,1,(FILE *)ref_mpi);
                    if (sVar5 != 1) {
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                             ,0xb01,"ref_gather_bin_ugrid","nqua",1,sVar5);
                      return 1;
                    }
                    _uStack_88 = (char *)npyr;
                    if (file._4_4_ != 0) {
                      uStack_88 = (undefined1)npyr;
                      xp_3._7_1_ = uStack_88;
                      uStack_87 = (undefined1)((ulong)npyr >> 8);
                      xp_3._6_1_ = uStack_87;
                      uStack_86 = (undefined1)((ulong)npyr >> 0x10);
                      xp_3._5_1_ = uStack_86;
                      uStack_85 = (undefined1)((ulong)npyr >> 0x18);
                      xp_3._4_1_ = uStack_85;
                      size_int._0_1_ = (undefined1)((ulong)npyr >> 0x20);
                      xp_3._3_1_ = (undefined1)size_int;
                      size_int._1_1_ = (undefined1)((ulong)npyr >> 0x28);
                      xp_3._2_1_ = size_int._1_1_;
                      size_int._2_1_ = (undefined1)((ulong)npyr >> 0x30);
                      xp_3._1_1_ = size_int._2_1_;
                      size_int._3_1_ = (undefined1)((ulong)npyr >> 0x38);
                      xp_3._0_1_ = size_int._3_1_;
                      _uStack_88 = xp_3;
                    }
                    sVar5 = fwrite(&stack0xffffffffffffff78,8,1,(FILE *)ref_mpi);
                    if (sVar5 != 1) {
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                             ,0xb05,"ref_gather_bin_ugrid","ntet",1,sVar5);
                      return 1;
                    }
                    _uStack_88 = (char *)npri;
                    if (file._4_4_ != 0) {
                      uStack_88 = (undefined1)npri;
                      xp_4._7_1_ = uStack_88;
                      uStack_87 = (undefined1)((ulong)npri >> 8);
                      xp_4._6_1_ = uStack_87;
                      uStack_86 = (undefined1)((ulong)npri >> 0x10);
                      xp_4._5_1_ = uStack_86;
                      uStack_85 = (undefined1)((ulong)npri >> 0x18);
                      xp_4._4_1_ = uStack_85;
                      size_int._0_1_ = (undefined1)((ulong)npri >> 0x20);
                      xp_4._3_1_ = (undefined1)size_int;
                      size_int._1_1_ = (undefined1)((ulong)npri >> 0x28);
                      xp_4._2_1_ = size_int._1_1_;
                      size_int._2_1_ = (undefined1)((ulong)npri >> 0x30);
                      xp_4._1_1_ = size_int._2_1_;
                      size_int._3_1_ = (undefined1)((ulong)npri >> 0x38);
                      xp_4._0_1_ = size_int._3_1_;
                      _uStack_88 = xp_4;
                    }
                    sVar5 = fwrite(&stack0xffffffffffffff78,8,1,(FILE *)ref_mpi);
                    if (sVar5 != 1) {
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                             ,0xb08,"ref_gather_bin_ugrid","npyr",1,sVar5);
                      return 1;
                    }
                    _uStack_88 = (char *)nhex;
                    if (file._4_4_ != 0) {
                      uStack_88 = (undefined1)nhex;
                      xp_5._7_1_ = uStack_88;
                      uStack_87 = (undefined1)((ulong)nhex >> 8);
                      xp_5._6_1_ = uStack_87;
                      uStack_86 = (undefined1)((ulong)nhex >> 0x10);
                      xp_5._5_1_ = uStack_86;
                      uStack_85 = (undefined1)((ulong)nhex >> 0x18);
                      xp_5._4_1_ = uStack_85;
                      size_int._0_1_ = (undefined1)((ulong)nhex >> 0x20);
                      xp_5._3_1_ = (undefined1)size_int;
                      size_int._1_1_ = (undefined1)((ulong)nhex >> 0x28);
                      xp_5._2_1_ = size_int._1_1_;
                      size_int._2_1_ = (undefined1)((ulong)nhex >> 0x30);
                      xp_5._1_1_ = size_int._2_1_;
                      size_int._3_1_ = (undefined1)((ulong)nhex >> 0x38);
                      xp_5._0_1_ = size_int._3_1_;
                      _uStack_88 = xp_5;
                    }
                    sVar5 = fwrite(&stack0xffffffffffffff78,8,1,(FILE *)ref_mpi);
                    if (sVar5 != 1) {
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                             ,0xb0b,"ref_gather_bin_ugrid","npri",1,sVar5);
                      return 1;
                    }
                    _uStack_88 = (char *)size_long;
                    if (file._4_4_ != 0) {
                      uStack_88 = (undefined1)size_long;
                      xp_6._7_1_ = uStack_88;
                      uStack_87 = (undefined1)((ulong)size_long >> 8);
                      xp_6._6_1_ = uStack_87;
                      uStack_86 = (undefined1)((ulong)size_long >> 0x10);
                      xp_6._5_1_ = uStack_86;
                      uStack_85 = (undefined1)((ulong)size_long >> 0x18);
                      xp_6._4_1_ = uStack_85;
                      size_int._0_1_ = (undefined1)((ulong)size_long >> 0x20);
                      xp_6._3_1_ = (undefined1)size_int;
                      size_int._1_1_ = (undefined1)((ulong)size_long >> 0x28);
                      xp_6._2_1_ = size_int._1_1_;
                      size_int._2_1_ = (undefined1)((ulong)size_long >> 0x30);
                      xp_6._1_1_ = size_int._2_1_;
                      size_int._3_1_ = (undefined1)((ulong)size_long >> 0x38);
                      xp_6._0_1_ = size_int._3_1_;
                      _uStack_88 = xp_6;
                    }
                    sVar5 = fwrite(&stack0xffffffffffffff78,8,1,(FILE *)ref_mpi);
                    if (sVar5 != 1) {
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                             ,0xb0e,"ref_gather_bin_ugrid","nhex",1,sVar5);
                      return 1;
                    }
                  }
                }
                if (0 < *(int *)&ref_node->age) {
                  ref_mpi_stopwatch_stop((REF_MPI)ref_node,"ugrid header");
                }
                uVar4 = ref_gather_node((REF_NODE)nnode,file._4_4_,0,0,(FILE *)ref_mpi);
                if (uVar4 == 0) {
                  if (0 < *(int *)&ref_node->age) {
                    ref_mpi_stopwatch_stop((REF_MPI)ref_node,"ugrid node");
                  }
                  uVar4 = ref_gather_cell((REF_NODE)nnode,*(REF_CELL *)(filename_local + 0x28),0,0,
                                          file._4_4_,(REF_BOOL)file,0,-1,0,(FILE *)ref_mpi);
                  if (uVar4 == 0) {
                    uVar4 = ref_gather_cell((REF_NODE)nnode,*(REF_CELL *)(filename_local + 0x40),0,0
                                            ,file._4_4_,(REF_BOOL)file,0,-1,0,(FILE *)ref_mpi);
                    if (uVar4 == 0) {
                      if (0 < *(int *)&ref_node->age) {
                        ref_mpi_stopwatch_stop((REF_MPI)ref_node,"ugrid face write");
                      }
                      uVar4 = ref_gather_cell((REF_NODE)nnode,*(REF_CELL *)(filename_local + 0x28),1
                                              ,0,file._4_4_,(REF_BOOL)file,0,-1,0,(FILE *)ref_mpi);
                      if (uVar4 == 0) {
                        uVar4 = ref_gather_cell((REF_NODE)nnode,*(REF_CELL *)(filename_local + 0x40)
                                                ,1,0,file._4_4_,(REF_BOOL)file,0,-1,0,
                                                (FILE *)ref_mpi);
                        if (uVar4 == 0) {
                          if (0 < *(int *)&ref_node->age) {
                            ref_mpi_stopwatch_stop((REF_MPI)ref_node,"ugrid faceid write");
                          }
                          version = 8;
                          _faceid = *(REF_CELL *)(filename_local + 0x50);
                          while (version < 0x10) {
                            uVar4 = ref_gather_cell((REF_NODE)nnode,_faceid,0,0,file._4_4_,
                                                    (REF_BOOL)file,0,-1,0,(FILE *)ref_mpi);
                            if (uVar4 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                     ,0xb56,"ref_gather_bin_ugrid",(ulong)uVar4,"cell c2n");
                              return uVar4;
                            }
                            if (0 < *(int *)&ref_node->age) {
                              ref_mpi_stopwatch_stop((REF_MPI)ref_node,"ugrid vol cell write");
                            }
                            version = version + 1;
                            _faceid = *(REF_CELL *)(filename_local + (long)version * 8 + 0x10);
                          }
                          if (*(int *)(*(long *)filename_local + 4) == 0) {
                            fclose((FILE *)ref_mpi);
                          }
                          ref_grid_local._4_4_ = 0;
                        }
                        else {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                 ,0xb4b,"ref_gather_bin_ugrid",(ulong)uVar4,"qua faceid");
                          ref_grid_local._4_4_ = uVar4;
                        }
                      }
                      else {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                               ,0xb47,"ref_gather_bin_ugrid",(ulong)uVar4,"tri faceid");
                        ref_grid_local._4_4_ = uVar4;
                      }
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                             ,0xb3c,"ref_gather_bin_ugrid",(ulong)uVar4,"qua c2n");
                      ref_grid_local._4_4_ = uVar4;
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                           ,0xb38,"ref_gather_bin_ugrid",(ulong)uVar4,"tri c2n");
                    ref_grid_local._4_4_ = uVar4;
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,0xb2d,"ref_gather_bin_ugrid",(ulong)uVar4,"nodes");
                  ref_grid_local._4_4_ = uVar4;
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0xaef,"ref_gather_bin_ugrid",(ulong)uVar4,"nhex");
                ref_grid_local._4_4_ = uVar4;
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0xaee,"ref_gather_bin_ugrid",(ulong)uVar4,"npri");
              ref_grid_local._4_4_ = uVar4;
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xaed,"ref_gather_bin_ugrid",(ulong)uVar4,"npyr");
            ref_grid_local._4_4_ = uVar4;
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0xaec,"ref_gather_bin_ugrid",(ulong)uVar4,"ntet");
          ref_grid_local._4_4_ = uVar4;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0xaea,"ref_gather_bin_ugrid",(ulong)uVar4,"nqua");
        ref_grid_local._4_4_ = uVar4;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0xae9,"ref_gather_bin_ugrid",(ulong)uVar4,"ntri");
      ref_grid_local._4_4_ = uVar4;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0xae5,
           "ref_gather_bin_ugrid",(ulong)uVar4,"sync");
    ref_grid_local._4_4_ = uVar4;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_bin_ugrid(REF_GRID ref_grid,
                                               const char *filename,
                                               REF_BOOL swap_endian,
                                               REF_BOOL sixty_four_bit) {
  FILE *file;
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GLOB nnode;
  REF_LONG ntri, nqua, ntet, npyr, npri, nhex;
  REF_LONG size_long;
  REF_INT size_int;
  REF_CELL ref_cell;
  REF_INT group;
  REF_INT faceid;
  REF_BOOL version = 0; /* meshb version, zero is no id */
  REF_BOOL faceid_insted_of_c2n, select_faceid;
  REF_BOOL pad = REF_FALSE;

  RSS(ref_node_synchronize_globals(ref_node), "sync");

  nnode = ref_node_n_global(ref_node);

  RSS(ref_cell_ncell(ref_grid_tri(ref_grid), ref_node, &ntri), "ntri");
  RSS(ref_cell_ncell(ref_grid_qua(ref_grid), ref_node, &nqua), "nqua");

  RSS(ref_cell_ncell(ref_grid_tet(ref_grid), ref_node, &ntet), "ntet");
  RSS(ref_cell_ncell(ref_grid_pyr(ref_grid), ref_node, &npyr), "npyr");
  RSS(ref_cell_ncell(ref_grid_pri(ref_grid), ref_node, &npri), "npri");
  RSS(ref_cell_ncell(ref_grid_hex(ref_grid), ref_node, &nhex), "nhex");

  file = NULL;
  if (ref_grid_once(ref_grid)) {
    file = fopen(filename, "w");
    if (NULL == (void *)file) printf("unable to open %s\n", filename);
    RNS(file, "unable to open file");

    if (sixty_four_bit) {
      size_long = (REF_LONG)nnode;
      if (swap_endian) SWAP_LONG(size_long);
      REIS(1, fwrite(&size_long, sizeof(REF_LONG), 1, file), "nnode");

      size_long = (REF_LONG)ntri;
      if (swap_endian) SWAP_LONG(size_long);
      REIS(1, fwrite(&size_long, sizeof(REF_LONG), 1, file), "ntri");
      size_long = (REF_LONG)nqua;
      if (swap_endian) SWAP_LONG(size_long);
      REIS(1, fwrite(&size_long, sizeof(REF_LONG), 1, file), "nqua");

      size_long = (REF_LONG)ntet;
      if (swap_endian) SWAP_LONG(size_long);
      REIS(1, fwrite(&size_long, sizeof(REF_LONG), 1, file), "ntet");
      size_long = (REF_LONG)npyr;
      if (swap_endian) SWAP_LONG(size_long);
      REIS(1, fwrite(&size_long, sizeof(REF_LONG), 1, file), "npyr");
      size_long = (REF_LONG)npri;
      if (swap_endian) SWAP_LONG(size_long);
      REIS(1, fwrite(&size_long, sizeof(REF_LONG), 1, file), "npri");
      size_long = (REF_LONG)nhex;
      if (swap_endian) SWAP_LONG(size_long);
      REIS(1, fwrite(&size_long, sizeof(REF_LONG), 1, file), "nhex");
    } else {
      size_int = (REF_INT)nnode;
      if (swap_endian) SWAP_INT(size_int);
      REIS(1, fwrite(&size_int, sizeof(REF_INT), 1, file), "nnode");

      size_int = (REF_INT)ntri;
      if (swap_endian) SWAP_INT(size_int);
      REIS(1, fwrite(&size_int, sizeof(REF_INT), 1, file), "ntri");
      size_int = (REF_INT)nqua;
      if (swap_endian) SWAP_INT(size_int);
      REIS(1, fwrite(&size_int, sizeof(REF_INT), 1, file), "nqua");

      size_int = (REF_INT)ntet;
      if (swap_endian) SWAP_INT(size_int);
      REIS(1, fwrite(&size_int, sizeof(REF_INT), 1, file), "ntet");
      size_int = (REF_INT)npyr;
      if (swap_endian) SWAP_INT(size_int);
      REIS(1, fwrite(&size_int, sizeof(REF_INT), 1, file), "npyr");
      size_int = (REF_INT)npri;
      if (swap_endian) SWAP_INT(size_int);
      REIS(1, fwrite(&size_int, sizeof(REF_INT), 1, file), "npri");
      size_int = (REF_INT)nhex;
      if (swap_endian) SWAP_INT(size_int);
      REIS(1, fwrite(&size_int, sizeof(REF_INT), 1, file), "nhex");
    }
  }
  if (0 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "ugrid header");

  RSS(ref_gather_node(ref_node, swap_endian, version, REF_FALSE, file),
      "nodes");

  if (0 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "ugrid node");

  faceid_insted_of_c2n = REF_FALSE;
  select_faceid = REF_FALSE;
  faceid = REF_EMPTY;
  RSS(ref_gather_cell(ref_node, ref_grid_tri(ref_grid), faceid_insted_of_c2n,
                      version, swap_endian, sixty_four_bit, select_faceid,
                      faceid, pad, file),
      "tri c2n");
  RSS(ref_gather_cell(ref_node, ref_grid_qua(ref_grid), faceid_insted_of_c2n,
                      version, swap_endian, sixty_four_bit, select_faceid,
                      faceid, pad, file),
      "qua c2n");

  if (0 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "ugrid face write");

  faceid_insted_of_c2n = REF_TRUE;
  select_faceid = REF_FALSE;
  faceid = REF_EMPTY;
  RSS(ref_gather_cell(ref_node, ref_grid_tri(ref_grid), faceid_insted_of_c2n,
                      version, swap_endian, sixty_four_bit, select_faceid,
                      faceid, pad, file),
      "tri faceid");
  RSS(ref_gather_cell(ref_node, ref_grid_qua(ref_grid), faceid_insted_of_c2n,
                      version, swap_endian, sixty_four_bit, select_faceid,
                      faceid, pad, file),
      "qua faceid");
  if (0 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "ugrid faceid write");

  faceid_insted_of_c2n = REF_FALSE;
  select_faceid = REF_FALSE;
  faceid = REF_EMPTY;
  each_ref_grid_3d_ref_cell(ref_grid, group, ref_cell) {
    RSS(ref_gather_cell(ref_node, ref_cell, faceid_insted_of_c2n, version,
                        swap_endian, sixty_four_bit, select_faceid, faceid, pad,
                        file),
        "cell c2n");
    if (0 < ref_mpi_timing(ref_mpi))
      ref_mpi_stopwatch_stop(ref_mpi, "ugrid vol cell write");
  }

  if (ref_grid_once(ref_grid)) fclose(file);

  return REF_SUCCESS;
}